

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.h
# Opt level: O2

void __thiscall
csm::GeometricModel::Parameter::Parameter
          (Parameter *this,string *paramName,double paramValue,string *paramUnits,Type paramType,
          SharingCriteria *paramSharingCriteria)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined2 uVar7;
  
  std::__cxx11::string::string((string *)this,(string *)paramName);
  this->value = paramValue;
  std::__cxx11::string::string((string *)&this->units,(string *)paramUnits);
  this->type = paramType;
  bVar2 = paramSharingCriteria->matchesSensorID;
  bVar3 = paramSharingCriteria->matchesPlatformID;
  bVar4 = paramSharingCriteria->matchesCollectionID;
  bVar5 = paramSharingCriteria->matchesTrajectoryID;
  bVar6 = paramSharingCriteria->matchesDateTime;
  uVar7 = *(undefined2 *)&paramSharingCriteria->field_0x6;
  dVar1 = paramSharingCriteria->maxTimeDelta;
  (this->sharingCriteria).matchesName = paramSharingCriteria->matchesName;
  (this->sharingCriteria).matchesSensorID = bVar2;
  (this->sharingCriteria).matchesPlatformID = bVar3;
  (this->sharingCriteria).matchesCollectionID = bVar4;
  (this->sharingCriteria).matchesTrajectoryID = bVar5;
  (this->sharingCriteria).matchesDateTime = bVar6;
  *(undefined2 *)&(this->sharingCriteria).field_0x6 = uVar7;
  (this->sharingCriteria).maxTimeDelta = dVar1;
  return;
}

Assistant:

Parameter(const std::string&      paramName,
                double                  paramValue,
                const std::string&      paramUnits,
                param::Type             paramType,
                const SharingCriteria&  paramSharingCriteria)
         :
            name            (paramName),
            value           (paramValue),
            units           (paramUnits),
            type            (paramType),
            sharingCriteria (paramSharingCriteria)
      {}